

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void tmat_to_dense(double *tmat,double *dmat,size_t n,double fill_diag)

{
  double dVar1;
  long local_58;
  long local_48;
  size_t i_1;
  size_t j;
  size_t i;
  size_t ncomb;
  double fill_diag_local;
  size_t n_local;
  double *dmat_local;
  double *tmat_local;
  
  if ((n & 1) == 0) {
    local_48 = (n >> 1) * (n - 1);
  }
  else {
    local_48 = n * (n - 1 >> 1);
  }
  for (i = 0; j = i, i < n - 1; i = i + 1) {
    while (j = j + 1, j < n) {
      if (i < j) {
        local_58 = (local_48 + (j - i) + -1) - ((n - i) * ((n - i) + -1) >> 1);
      }
      else {
        local_58 = (local_48 + (i - j) + -1) - ((n - j) * ((n - j) + -1) >> 1);
      }
      dVar1 = tmat[local_58];
      dmat[j + i * n] = dVar1;
      dmat[i + j * n] = dVar1;
    }
  }
  for (i_1 = 0; i_1 < n; i_1 = i_1 + 1) {
    dmat[i_1 + i_1 * n] = fill_diag;
  }
  return;
}

Assistant:

void tmat_to_dense(double *restrict tmat, double *restrict dmat, size_t n, double fill_diag)
{
    size_t ncomb = calc_ncomb(n);
    for (size_t i = 0; i < (n-1); i++)
    {
        for (size_t j = i + 1; j < n; j++)
        {
            // dmat[i + j * n] = dmat[j + i * n] = tmat[i * (n - (i+1)/2) + j - i - 1];
            dmat[i + j * n] = dmat[j + i * n] = tmat[ix_comb(i, j, n, ncomb)];
        }
    }
    for (size_t i = 0; i < n; i++)
        dmat[i + i * n] = fill_diag;
}